

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.hpp
# Opt level: O2

void __thiscall
myvk::Buffer::UpdateData<unsigned_char*>(Buffer *this,uchar *begin,uchar *end,uint32_t byte_offset)

{
  void *pvVar1;
  
  if (this->m_mapped_ptr == (void *)0x0) {
    pvVar1 = Map(this);
    if ((long)end - (long)begin != 0) {
      memmove((void *)((long)pvVar1 + (ulong)byte_offset),begin,(long)end - (long)begin);
    }
    Unmap(this);
    return;
  }
  if ((long)end - (long)begin != 0) {
    memmove((void *)((long)this->m_mapped_ptr + (ulong)byte_offset),begin,(long)end - (long)begin);
    return;
  }
  return;
}

Assistant:

inline void UpdateData(Iter begin, Iter end, uint32_t byte_offset = 0) const {
		using T = typename std::iterator_traits<Iter>::value_type;
		if (m_mapped_ptr) {
			std::copy(begin, end, (T *)((uint8_t *)GetMappedData() + byte_offset));
		} else {
			std::copy(begin, end, (T *)((uint8_t *)Map() + byte_offset));
			Unmap();
		}
	}